

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

FT_Error IsMacResource(FT_Library library,FT_Stream stream,FT_Long resource_offset,
                      FT_Long face_index,FT_Face_conflict *aface)

{
  FT_Byte *pFVar1;
  ushort uVar2;
  FT_Stream stream_00;
  uint uVar3;
  FT_UShort FVar4;
  FT_Error FVar5;
  unsigned_long uVar6;
  FT_Byte *base;
  FT_ULong FVar7;
  FT_ULong FVar8;
  int *buffer;
  FT_ULong count_00;
  FT_Memory pFVar9;
  uint uVar10;
  FT_Parameter *params;
  char *driver_name;
  FT_Face_conflict *aface_00;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  uint local_ac;
  long local_a8;
  FT_ULong local_a0;
  FT_Long *data_offsets;
  FT_ULong local_90;
  FT_Library local_88;
  FT_Memory local_80;
  uint local_74;
  ulong local_70;
  FT_Memory local_68;
  FT_Face_conflict *local_60;
  FT_Long count;
  FT_Memory local_50;
  FT_Stream local_48;
  FT_Long rdata_pos;
  FT_Long map_offset;
  
  pFVar9 = library->memory;
  FVar5 = FT_Raccess_Get_HeaderInfo(library,stream,resource_offset,&map_offset,&rdata_pos);
  if (FVar5 != 0) {
    return FVar5;
  }
  local_60 = aface;
  local_50 = pFVar9;
  FVar5 = FT_Raccess_Get_DataOffsets
                    (library,stream,map_offset,rdata_pos,0x504f5354,'\x01',&data_offsets,&count);
  if (FVar5 == 0) {
    local_80 = (FT_Memory)data_offsets;
    local_ac = 1;
    uVar10 = 1;
    if (face_index + 1U < 2) {
      local_68 = library->memory;
      if (count < 1) {
        uVar12 = 0;
        local_88 = library;
      }
      else {
        lVar13 = 0;
        uVar12 = 0;
        local_88 = library;
        do {
          uVar11 = *(ulong *)((long)local_80 + lVar13 * 8);
          if (stream->read == (FT_Stream_IoFunc)0x0) {
            bVar15 = uVar11 <= stream->size;
          }
          else {
            uVar6 = (*stream->read)(stream,uVar11,(uchar *)0x0,0);
            bVar15 = uVar6 == 0;
          }
          if (!bVar15) {
            local_ac = 0x55;
            uVar10 = local_ac;
            goto LAB_0013a0a7;
          }
          stream->pos = uVar11;
          local_ac = 0;
          FVar7 = FT_Stream_ReadULong(stream,(FT_Error *)&local_ac);
          uVar10 = local_ac;
          if (local_ac != 0) goto LAB_0013a0a7;
          if ((0xffffff < FVar7) || (0xffffff - FVar7 < uVar12 + 6)) {
            local_ac = 9;
            uVar10 = local_ac;
            goto LAB_0013a0a7;
          }
          uVar12 = uVar12 + FVar7 + 6;
          lVar13 = lVar13 + 1;
        } while (count != lVar13);
      }
      uVar11 = uVar12 + 2;
      if (uVar11 < 6) {
        local_ac = 10;
        uVar10 = local_ac;
      }
      else {
        local_a0 = count;
        if ((long)uVar11 < 1) {
          uVar10 = 6;
          base = (FT_Byte *)0x0;
        }
        else {
          base = (FT_Byte *)(*local_68->alloc)(local_68,uVar11);
          uVar10 = (uint)(base == (FT_Byte *)0x0) << 6;
          if ((base == (FT_Byte *)0x0) == 0) {
            memset(base,0,uVar11);
          }
        }
        local_ac = uVar10;
        if (uVar10 == 0) {
          base[0] = 0x80;
          base[1] = '\x01';
          base[2] = '\0';
          base[3] = '\0';
          base[4] = '\0';
          base[5] = '\0';
          local_70 = uVar11;
          if ((long)local_a0 < 1) {
            local_a8 = 2;
            uVar11 = 6;
            local_90 = 0;
          }
          else {
            local_74 = 1;
            uVar11 = 6;
            local_a8 = 2;
            FVar7 = 0;
            local_90 = 0;
            local_ac = 0;
            do {
              uVar14 = *(ulong *)((long)local_80 + FVar7 * 8);
              if (stream->read == (FT_Stream_IoFunc)0x0) {
                bVar15 = uVar14 <= stream->size;
              }
              else {
                uVar6 = (*stream->read)(stream,uVar14,(uchar *)0x0,0);
                bVar15 = uVar6 == 0;
              }
              if (!bVar15) {
                local_ac = 0x55;
                goto LAB_0013a08a;
              }
              stream->pos = uVar14;
              local_ac = 0;
              FVar8 = FT_Stream_ReadULong(stream,(FT_Error *)&local_ac);
              if (local_ac != 0) goto LAB_0013a08a;
              if (FVar8 >> 0x1f != 0) {
                local_ac = 9;
                goto LAB_0013a08a;
              }
              FVar4 = FT_Stream_ReadUShort(stream,(FT_Error *)&local_ac);
              if (local_ac != 0) goto LAB_0013a08a;
              local_ac = 10;
              if (0xff < FVar4) {
                uVar2 = FVar4 >> 8;
                count_00 = 0;
                if (1 < FVar8) {
                  count_00 = FVar8 - 2;
                }
                if (local_74 == uVar2) {
                  uVar14 = uVar11;
                  local_90 = local_90 + count_00;
                }
                else {
                  if (local_70 < local_a8 + 3U) goto LAB_0013a08a;
                  *(int *)(base + local_a8) = (int)local_90;
                  if (uVar2 == 5) break;
                  uVar14 = uVar11 + 6;
                  if (local_70 < uVar14) goto LAB_0013a08a;
                  base[uVar11] = 0x80;
                  local_a8 = uVar11 + 2;
                  base[uVar11 + 1] = (FT_Byte)(FVar4 >> 8);
                  pFVar1 = base + uVar11 + 2;
                  pFVar1[0] = '\0';
                  pFVar1[1] = '\0';
                  pFVar1[2] = '\0';
                  pFVar1[3] = '\0';
                  local_74 = (uint)uVar2;
                  local_90 = count_00;
                }
                if (((uVar12 < uVar14) || (uVar11 = count_00 + uVar14, uVar12 < uVar11)) ||
                   (local_ac = FT_Stream_Read(stream,base + uVar14,count_00), local_ac != 0))
                goto LAB_0013a08a;
              }
              FVar7 = FVar7 + 1;
            } while (local_a0 != FVar7);
          }
          local_ac = 10;
          if ((local_70 < uVar11 + 2) ||
             ((base + uVar11)[0] = 0x80, (base + uVar11)[1] = '\x03', local_70 < local_a8 + 3U)) {
LAB_0013a08a:
            local_ac = (uint)(local_ac != 0);
            (*local_68->free)(local_68,base);
            uVar10 = local_ac;
          }
          else {
            *(int *)(base + local_a8) = (int)local_90;
            uVar10 = open_face_from_buffer(local_88,base,uVar11 + 2,0,"type1",local_60);
          }
        }
      }
    }
LAB_0013a0a7:
    if (data_offsets != (FT_Long *)0x0) {
      (*local_50->free)(local_50,data_offsets);
    }
    if (uVar10 != 0) {
      return uVar10;
    }
    count = 1;
    uVar10 = 0;
  }
  else {
    params = (FT_Parameter *)0x73666e74;
    aface_00 = (FT_Face_conflict *)0x0;
    FVar5 = FT_Raccess_Get_DataOffsets
                      (library,stream,map_offset,rdata_pos,0x73666e74,'\0',&data_offsets,&count);
    if (FVar5 != 0) {
      return FVar5;
    }
    uVar12 = face_index % count >> 0x3f ^ face_index % count;
    pFVar9 = (FT_Memory)data_offsets;
    uVar10 = 1;
    uVar3 = local_ac;
    if ((long)uVar12 < count) {
      local_80 = library->memory;
      uVar11 = data_offsets[uVar12];
      local_48 = stream;
      if (stream->read == (FT_Stream_IoFunc)0x0) {
        bVar15 = uVar11 <= stream->size;
      }
      else {
        uVar6 = (*stream->read)(stream,uVar11,(uchar *)0x0,0);
        bVar15 = uVar6 == 0;
      }
      stream_00 = local_48;
      uVar10 = 0x55;
      uVar3 = uVar10;
      if (bVar15) {
        local_48->pos = uVar11;
        local_68 = (FT_Memory)data_offsets;
        local_ac = 0;
        local_88 = library;
        FVar7 = FT_Stream_ReadULong(local_48,(FT_Error *)&local_ac);
        pFVar9 = local_68;
        uVar10 = local_ac;
        uVar3 = local_ac;
        if (((local_ac == 0) && (uVar10 = 1, FVar7 != 0)) &&
           ((uVar10 = 9, FVar7 < 0x1000000 &&
            (local_a0 = FVar7,
            local_ac = open_face_PS_from_sfnt_stream
                                 (local_88,stream_00,uVar12,(FT_Int)local_60,params,aface_00),
            uVar10 = local_ac, uVar3 = local_ac, local_ac != 0)))) {
          uVar11 = uVar11 + 4;
          if (stream_00->read == (FT_Stream_IoFunc)0x0) {
            bVar15 = uVar11 <= stream_00->size;
          }
          else {
            uVar6 = (*stream_00->read)(stream_00,uVar11,(uchar *)0x0,0);
            bVar15 = uVar6 == 0;
          }
          FVar7 = local_a0;
          uVar10 = 0x55;
          uVar3 = uVar10;
          if (bVar15) {
            stream_00->pos = uVar11;
            local_ac = 0;
            buffer = (int *)(*local_80->alloc)(local_80,local_a0);
            uVar10 = (uint)(buffer == (int *)0x0) << 6;
            uVar3 = uVar10;
            if (buffer != (int *)0x0) {
              memset(buffer,0,FVar7);
              local_ac = uVar10;
              local_ac = FT_Stream_Read(stream_00,(FT_Byte *)buffer,FVar7);
              if (local_ac == 0) {
                if (FVar7 < 5) {
                  driver_name = "truetype";
                }
                else {
                  driver_name = "truetype";
                  if (*buffer == 0x4f54544f) {
                    driver_name = "cff";
                  }
                }
                uVar10 = open_face_from_buffer
                                   (local_88,(FT_Byte *)buffer,local_a0,0,driver_name,local_60);
                uVar3 = uVar10;
              }
              else {
                (*local_80->free)(local_80,buffer);
                uVar10 = local_ac;
                uVar3 = local_ac;
              }
            }
          }
        }
      }
    }
    local_ac = uVar3;
    if (pFVar9 != (FT_Memory)0x0) {
      (*local_50->free)(local_50,pFVar9);
    }
    if (uVar10 != 0) {
      return uVar10;
    }
  }
  (*local_60)->num_faces = count;
  return uVar10;
}

Assistant:

static FT_Error
  IsMacResource( FT_Library  library,
                 FT_Stream   stream,
                 FT_Long     resource_offset,
                 FT_Long     face_index,
                 FT_Face    *aface )
  {
    FT_Memory  memory = library->memory;
    FT_Error   error;
    FT_Long    map_offset, rdata_pos;
    FT_Long    *data_offsets;
    FT_Long    count;


    error = FT_Raccess_Get_HeaderInfo( library, stream, resource_offset,
                                       &map_offset, &rdata_pos );
    if ( error )
      return error;

    /* POST resources must be sorted to concatenate properly */
    error = FT_Raccess_Get_DataOffsets( library, stream,
                                        map_offset, rdata_pos,
                                        TTAG_POST, TRUE,
                                        &data_offsets, &count );
    if ( !error )
    {
      error = Mac_Read_POST_Resource( library, stream, data_offsets, count,
                                      face_index, aface );
      FT_FREE( data_offsets );
      /* POST exists in an LWFN providing a single face */
      if ( !error )
        (*aface)->num_faces = 1;
      return error;
    }

    /* sfnt resources should not be sorted to preserve the face order by
       QuickDraw API */
    error = FT_Raccess_Get_DataOffsets( library, stream,
                                        map_offset, rdata_pos,
                                        TTAG_sfnt, FALSE,
                                        &data_offsets, &count );
    if ( !error )
    {
      FT_Long  face_index_internal = face_index % count;


      error = Mac_Read_sfnt_Resource( library, stream, data_offsets, count,
                                      face_index_internal, aface );
      FT_FREE( data_offsets );
      if ( !error )
        (*aface)->num_faces = count;
    }

    return error;
  }